

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O3

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,int n)

{
  byte bVar1;
  byte *pbVar2;
  StringBuffer *pSVar3;
  byte *pbVar4;
  byte *__n;
  undefined8 in_RDX;
  byte *__buf;
  bool bVar5;
  char fbuf [64];
  byte local_48;
  byte local_47 [71];
  
  pbVar2 = &local_48;
  if (n < 0) {
    local_48 = 0x2d;
    n = -n;
    pbVar4 = local_47;
  }
  else {
    pbVar4 = &local_48;
    if (n == 0) {
      pbVar4 = local_47;
      local_48 = 0x30;
      goto LAB_0012daf5;
    }
  }
  pbVar2 = pbVar4;
  in_RDX = 0xcccccccd;
  pbVar4 = pbVar2;
  do {
    *pbVar4 = (char)n + (char)((uint)n / 10) * -10 | 0x30;
    pbVar4 = pbVar4 + 1;
    bVar5 = 9 < (uint)n;
    n = (uint)n / 10;
  } while (bVar5);
LAB_0012daf5:
  *pbVar4 = 0;
  __buf = (byte *)CONCAT71((int7)((ulong)in_RDX >> 8),pbVar2 != pbVar4);
  __n = pbVar4 + -1;
  if (pbVar2 < __n && pbVar2 != pbVar4) {
    pbVar2 = pbVar2 + 1;
    do {
      bVar1 = pbVar2[-1];
      pbVar2[-1] = *__n;
      *__n = bVar1;
      __n = __n + -1;
      __buf = pbVar2 + 1;
      bVar5 = pbVar2 < __n;
      pbVar2 = __buf;
    } while (bVar5);
  }
  pSVar3 = (StringBuffer *)write(this,(int)&local_48,__buf,(size_t)__n);
  return pSVar3;
}

Assistant:

StringBuffer& operator<<(int n)                { _ITOA(n); }